

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

shared_ptr<const_nigel::Token_Identifier> __thiscall
nigel::Token::as<nigel::Token_Identifier>(Token *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<const_nigel::Token_Identifier> sVar1;
  __shared_ptr<nigel::Token_const,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<nigel::Token_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<nigel::Token,void>
            (local_20,(__weak_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  std::static_pointer_cast<nigel::Token_Identifier_const,nigel::Token_const>
            ((shared_ptr<const_nigel::Token> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  sVar1.super___shared_ptr<const_nigel::Token_Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_nigel::Token_Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_nigel::Token_Identifier>)
         sVar1.super___shared_ptr<const_nigel::Token_Identifier,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const T> as() const
		{
			return std::static_pointer_cast< const T >( shared_from_this() );
		}